

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O3

LLVMValueRef CompileLlvmBlock(LlvmCompilationContext *ctx,ExprBlock *node)

{
  ExprBase *expression;
  
  for (expression = (node->expressions).head; expression != (ExprBase *)0x0;
      expression = expression->next) {
    CompileLlvm(ctx,expression);
  }
  if (node->closures != (ExprBase *)0x0) {
    CompileLlvm(ctx,node->closures);
  }
  if ((node->super_ExprBase).type == ctx->ctx->typeVoid) {
    return (LLVMValueRef)0x0;
  }
  __assert_fail("node->type == ctx.ctx.typeVoid",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x27b,"LLVMValueRef CheckType(LlvmCompilationContext &, ExprBase *, LLVMValueRef)")
  ;
}

Assistant:

LLVMValueRef CompileLlvmBlock(LlvmCompilationContext &ctx, ExprBlock *node)
{
	for(ExprBase *value = node->expressions.head; value; value = value->next)
		CompileLlvm(ctx, value);

	if(node->closures)
		CompileLlvm(ctx, node->closures);

	return CheckType(ctx, node, NULL);
}